

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AndEvaluationTest.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  undefined8 *puVar3;
  ostream *poVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long *plVar6;
  size_type *psVar7;
  undefined8 uVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  Variable x;
  Variable y;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  Variable local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  Variable local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  Expression local_a8;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_158._M_dataplus._M_p = (pointer)0x0;
  local_118._vptr_Variable = (_func_int **)&PTR_differentiate_0010ccb0;
  local_118.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::VariableExpression,std::allocator<Kandinsky::VariableExpression>,double&>
            (&local_118.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(VariableExpression **)&local_118.m_variableExpressionPtr,
             (allocator<Kandinsky::VariableExpression> *)&local_138,(double *)&local_158);
  local_158._M_dataplus._M_p = (pointer)0x0;
  local_e0._vptr_Variable = (_func_int **)&PTR_differentiate_0010ccb0;
  local_e0.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::VariableExpression,std::allocator<Kandinsky::VariableExpression>,double&>
            (&local_e0.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(VariableExpression **)&local_e0.m_variableExpressionPtr,
             (allocator<Kandinsky::VariableExpression> *)&local_138,(double *)&local_158);
  (local_118.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  (local_e0.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       0.0;
  Kandinsky::operator&&<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_a8,&local_118,&local_e0);
  (**(local_a8.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_118.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_100,vsnprintf,0x148,"%f");
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_100);
  paVar1 = &local_138.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 == paVar5) {
    local_138.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_138.field_2._8_8_ = plVar2[3];
    local_138._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_138._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_138._M_string_length = plVar2[1];
  *plVar2 = (long)paVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (**((local_e0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_c8,vsnprintf,0x148,"%f");
  uVar8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    uVar8 = local_138.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      (local_138._M_string_length + local_c8._M_string_length)) {
    uVar8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,local_c8._M_dataplus._M_p._0_4_) !=
        &local_c8.field_2) {
      uVar8 = local_c8.field_2._M_allocated_capacity;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        (local_138._M_string_length + local_c8._M_string_length) <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_c8,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p);
      goto LAB_00107515;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_138,
                      CONCAT44(local_c8._M_dataplus._M_p._4_4_,local_c8._M_dataplus._M_p._0_4_));
LAB_00107515:
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  psVar7 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_158.field_2._M_allocated_capacity = *psVar7;
    local_158.field_2._8_8_ = puVar3[3];
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar7;
    local_158._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_158._M_string_length = puVar3[1];
  *puVar3 = psVar7;
  puVar3[1] = 0;
  *(undefined1 *)psVar7 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_158);
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_40 = *plVar6;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar6;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((extraout_XMM0_Qa != 0.0) || (NAN(extraout_XMM0_Qa))) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_50,local_48);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    paVar5 = &local_158.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar5) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,local_c8._M_dataplus._M_p._0_4_) !=
        &local_c8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_c8._M_dataplus._M_p._4_4_,local_c8._M_dataplus._M_p._0_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    local_a8._vptr_Expression = (_func_int **)&PTR_variables_0010ccd8;
    if (local_a8.m_baseExpressionPtr.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.m_baseExpressionPtr.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_100._M_dataplus._M_p._0_4_ = 1;
    Kandinsky::operator&&<Kandinsky::Variable,_int,_nullptr>
              ((Expression *)&local_138,&local_118,(int *)&local_100);
    (*(code *)**(undefined8 **)local_138._M_string_length)();
    (**((local_118.m_variableExpressionPtr.
         super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super_BaseExpression)._vptr_BaseExpression)();
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_158,vsnprintf,0x148,"%f");
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_158);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar2[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar2;
    }
    local_68 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((extraout_XMM0_Qa_00 != 1.0) || (NAN(extraout_XMM0_Qa_00))) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_70,local_68);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar5) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      local_138._M_dataplus._M_p = (pointer)&PTR_variables_0010ccd8;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.field_2._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_138.field_2._M_allocated_capacity);
      }
      local_c8._M_dataplus._M_p._0_4_ = 1;
      Kandinsky::operator&&<int,_Kandinsky::Variable,_nullptr>
                ((Expression *)&local_100,(int *)&local_c8,&local_118);
      (*(code *)**(undefined8 **)local_100._M_string_length)();
      (**((local_118.m_variableExpressionPtr.
           super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_BaseExpression)._vptr_BaseExpression)();
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_138,vsnprintf,0x148,"%f");
      puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x10a021)
      ;
      psVar7 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_158.field_2._M_allocated_capacity = *psVar7;
        local_158.field_2._8_8_ = puVar3[3];
        local_158._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar7;
        local_158._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_158._M_string_length = puVar3[1];
      *puVar3 = psVar7;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_158);
      plVar6 = plVar2 + 2;
      if ((long *)*plVar2 == plVar6) {
        local_80 = *plVar6;
        lStack_78 = plVar2[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar6;
        local_90 = (long *)*plVar2;
      }
      local_88 = plVar2[1];
      *plVar2 = (long)plVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((extraout_XMM0_Qa_01 == 1.0) && (!NAN(extraout_XMM0_Qa_01))) {
        if (local_90 != &local_80) {
          operator_delete(local_90);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar5) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar1) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        local_100._M_dataplus._M_p = (pointer)&PTR_variables_0010ccd8;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100.field_2._M_allocated_capacity
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_100.field_2._M_allocated_capacity);
        }
        local_e0._vptr_Variable = (_func_int **)&PTR_differentiate_0010ccb0;
        if (local_e0.m_variableExpressionPtr.
            super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e0.m_variableExpressionPtr.
                     super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_118._vptr_Variable = (_func_int **)&PTR_differentiate_0010ccb0;
        if (local_118.m_variableExpressionPtr.
            super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118.m_variableExpressionPtr.
                     super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        return 0;
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_90,local_88);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  exit(1);
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(0);
    assertOrExit((x && y).evaluate() == 0, std::to_string(x.evaluate()) + " && " + std::to_string(y.evaluate()) + " != 0");
    assertOrExit((x && 1).evaluate() == 1, std::to_string(x.evaluate()) + " && 1 != 1");
    assertOrExit((1 && x).evaluate() == 1, "1 && " + std::to_string(x.evaluate()) + " != 1");
    return 0;
}